

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O0

void __thiscall
deqp::gls::anon_unknown_1::AttributeArray::AttributeArray
          (AttributeArray *this,Storage storage,Context *context)

{
  deUint32 err;
  Context *context_local;
  Storage storage_local;
  AttributeArray *this_local;
  
  this->m_storage = storage;
  this->m_ctx = context;
  this->m_glBuffer = 0;
  this->m_size = 0;
  this->m_data = (char *)0x0;
  this->m_componentCount = 1;
  this->m_bound = false;
  this->m_target = TARGET_ARRAY;
  this->m_inputType = INPUTTYPE_FLOAT;
  this->m_outputType = OUTPUTTYPE_VEC4;
  this->m_normalize = false;
  this->m_stride = 0;
  this->m_offset = 0;
  rr::GenericVec4::GenericVec4(&this->m_defaultAttrib);
  this->m_instanceDivisor = 0;
  this->m_isPositionAttr = false;
  this->m_bgraOrder = false;
  if (this->m_storage == STORAGE_BUFFER) {
    (*this->m_ctx->_vptr_Context[0x26])(this->m_ctx,1,&this->m_glBuffer);
    err = (*this->m_ctx->_vptr_Context[0x79])();
    glu::checkError(err,"glGenBuffers()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsDrawTest.cpp"
                    ,0x3ba);
  }
  return;
}

Assistant:

AttributeArray::AttributeArray (DrawTestSpec::Storage storage, sglr::Context& context)
	: m_storage			(storage)
	, m_ctx				(context)
	, m_glBuffer		(0)
	, m_size			(0)
	, m_data			(DE_NULL)
	, m_componentCount	(1)
	, m_bound			(false)
	, m_target			(DrawTestSpec::TARGET_ARRAY)
	, m_inputType		(DrawTestSpec::INPUTTYPE_FLOAT)
	, m_outputType		(DrawTestSpec::OUTPUTTYPE_VEC4)
	, m_normalize		(false)
	, m_stride			(0)
	, m_offset			(0)
	, m_instanceDivisor	(0)
	, m_isPositionAttr	(false)
	, m_bgraOrder		(false)
{
	if (m_storage == DrawTestSpec::STORAGE_BUFFER)
	{
		m_ctx.genBuffers(1, &m_glBuffer);
		GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glGenBuffers()");
	}
}